

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_bfset_32_di(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  sbyte sVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
    return;
  }
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar5 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar5 = pmmu_translate_addr(uVar5);
  }
  uVar1 = m68k_read_memory_16(uVar5 & m68ki_cpu.address_mask);
  uVar5 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar6 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar6 = pmmu_translate_addr(uVar6);
  }
  uVar2 = m68k_read_memory_16(uVar6 & m68ki_cpu.address_mask);
  if ((uVar1 >> 0xb & 1) == 0) {
    uVar6 = uVar1 >> 6 & 0x1f;
  }
  else {
    uVar6 = m68ki_cpu.dar[uVar1 >> 6 & 7];
  }
  if ((uVar1 & 0x20) != 0) {
    uVar1 = m68ki_cpu.dar[uVar1 & 7];
  }
  uVar8 = uVar6 + 7;
  if (-1 < (int)uVar6) {
    uVar8 = uVar6;
  }
  uVar7 = (int)(short)uVar2 + uVar5 + ((int)uVar8 >> 3) + -1 +
          (uint)((uVar6 & 0x80000007) < 0x80000001);
  uVar9 = uVar1 - 1 & 0x1f;
  uVar2 = -1 << (~(byte)uVar9 & 0x1f);
  sVar4 = (sbyte)(uVar6 & 7);
  uVar8 = uVar2 >> sVar4;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar5 = uVar7;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar5 = pmmu_translate_addr(uVar7);
  }
  uVar3 = m68k_read_memory_32(uVar5 & m68ki_cpu.address_mask);
  m68ki_cpu.n_flag = (uVar3 << sVar4) >> 0x18;
  m68ki_cpu.not_z_flag = uVar3 & uVar8;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  uVar5 = uVar7;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar5 = pmmu_translate_addr(uVar7);
  }
  m68k_write_memory_32(uVar5 & m68ki_cpu.address_mask,uVar3 | uVar8);
  if (0x20 < (uVar6 & 7) + uVar9 + 1) {
    uVar7 = uVar7 + 4;
    my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
    uVar5 = uVar7;
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar5 = pmmu_translate_addr(uVar7);
    }
    uVar8 = m68k_read_memory_8(uVar5 & m68ki_cpu.address_mask);
    uVar2 = uVar2 & 0xff;
    m68ki_cpu.not_z_flag = m68ki_cpu.not_z_flag | uVar8 & uVar2;
    my_fc_handler(m68ki_cpu.s_flag | 1);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar7 = pmmu_translate_addr(uVar7);
    }
    m68k_write_memory_8(uVar7 & m68ki_cpu.address_mask,uVar8 | uVar2);
    return;
  }
  return;
}

Assistant:

static void m68k_op_bfset_32_di(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		sint offset = (word2>>6)&31;
		uint width = word2;
		uint mask_base;
		uint data_long;
		uint mask_long;
		uint data_byte = 0;
		uint mask_byte = 0;
		uint ea = EA_AY_DI_8();


		if(BIT_B(word2))
			offset = MAKE_INT_32(REG_D[offset&7]);
		if(BIT_5(word2))
			width = REG_D[width&7];

		/* Offset is signed so we have to use ugly math =( */
		ea += offset / 8;
		offset %= 8;
		if(offset < 0)
		{
			offset += 8;
			ea--;
		}
		width = ((width-1) & 31) + 1;


		mask_base = MASK_OUT_ABOVE_32(0xffffffff << (32 - width));
		mask_long = mask_base >> offset;

		data_long = m68ki_read_32(ea);
		FLAG_N = NFLAG_32(data_long << offset);
		FLAG_Z = data_long & mask_long;
		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;

		m68ki_write_32(ea, data_long | mask_long);

		if((width + offset) > 32)
		{
			mask_byte = MASK_OUT_ABOVE_8(mask_base);
			data_byte = m68ki_read_8(ea+4);
			FLAG_Z |= (data_byte & mask_byte);
			m68ki_write_8(ea+4, data_byte | mask_byte);
		}
		return;
	}
	m68ki_exception_illegal();
}